

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::makect(int nc,int *ip,double *c)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  ip[1] = nc;
  if (1 < nc) {
    uVar2 = (uint)nc >> 1;
    dVar6 = 0.7853981633974483 / (double)uVar2;
    dVar4 = cos((double)uVar2 * dVar6);
    *c = dVar4;
    c[uVar2] = dVar4 * 0.5;
    uVar3 = (ulong)(uint)nc;
    for (uVar1 = 1; uVar3 = uVar3 - 1, uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar4 = (double)(int)uVar1 * dVar6;
      dVar5 = cos(dVar4);
      c[uVar1] = dVar5 * 0.5;
      dVar4 = sin(dVar4);
      c[uVar3] = dVar4 * 0.5;
    }
  }
  return;
}

Assistant:

void makect(int nc, int *ip, double *c) {
  int j, nch;
  double delta;

  ip[1] = nc;
  if (nc > 1) {
    nch = nc >> 1;
    delta = atan(1.0) / nch;
    c[0] = cos(delta * nch);
    c[nch] = 0.5 * c[0];
    for (j = 1; j < nch; j++) {
      c[j] = 0.5 * cos(delta * j);
      c[nc - j] = 0.5 * sin(delta * j);
    }
  }
}